

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O1

iterator __thiscall
QMultiMap<int,_ProString>::insert(QMultiMap<int,_ProString> *this,int *key,ProString *value)

{
  QMapData<std::multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>_>
  *pQVar1;
  _Base_ptr p_Var2;
  iterator iVar3;
  const_iterator __position;
  long in_FS_OFFSET;
  QMultiMap<int,_ProString> copy;
  pair<const_int,_ProString> local_70;
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>_>_>
  local_38;
  _Alloc_node local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 == (QMapData<std::multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>_>
                  *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value == (__atomic_base<int>)0x1)) {
    local_38.d.ptr =
         (totally_ordered_wrapper<QMapData<std::multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>_>_*>
          )(QMapData<std::multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>_>
            *)0x0;
  }
  else {
    local_38.d.ptr =
         (totally_ordered_wrapper<QMapData<std::multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>_>_*>
          )(this->d).d.ptr;
    if (local_38.d.ptr !=
        (QMapData<std::multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>_>
         *)0x0) {
      LOCK();
      (((QMapData<std::multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>_>
         *)local_38.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value =
           (Type)((int)(((QMapData<std::multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>_>
                          *)local_38.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value + 1);
      UNLOCK();
    }
  }
  detach(this);
  pQVar1 = (this->d).d.ptr;
  local_30._M_t = &(pQVar1->m)._M_t;
  p_Var2 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
  __position._M_node = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var2 != (_Base_ptr)0x0) {
    do {
      if (*key <= (int)p_Var2[1]._M_color) {
        __position._M_node = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < *key];
    } while (p_Var2 != (_Base_ptr)0x0);
  }
  local_70.first = *key;
  ProString::ProString(&local_70.second,value);
  iVar3 = std::
          _Rb_tree<int,std::pair<int_const,ProString>,std::_Select1st<std::pair<int_const,ProString>>,std::less<int>,std::allocator<std::pair<int_const,ProString>>>
          ::
          _M_insert_equal_<std::pair<int_const,ProString>,std::_Rb_tree<int,std::pair<int_const,ProString>,std::_Select1st<std::pair<int_const,ProString>>,std::less<int>,std::allocator<std::pair<int_const,ProString>>>::_Alloc_node>
                    ((_Rb_tree<int,std::pair<int_const,ProString>,std::_Select1st<std::pair<int_const,ProString>>,std::less<int>,std::allocator<std::pair<int_const,ProString>>>
                      *)local_30._M_t,__position,&local_70,&local_30);
  if (&(local_70.second.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.second.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.second.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
         _M_i + -1;
    UNLOCK();
    if (((local_70.second.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_70.second.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)(iterator)iVar3._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const Key &key, const T &value)
    {
        const auto copy = d.isShared() ? *this : QMultiMap(); // keep `key`/`value` alive across the detach
        detach();
        // note that std::multimap inserts at the end of an equal_range for a key,
        // QMultiMap at the beginning.
        auto i = d->m.lower_bound(key);
        return iterator(d->m.insert(i, {key, value}));
    }